

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogStream.h
# Opt level: O0

void __thiscall FixedBuffer<4000000>::append(FixedBuffer<4000000> *this,char *buf,size_t len)

{
  int iVar1;
  size_t len_local;
  char *buf_local;
  FixedBuffer<4000000> *this_local;
  
  iVar1 = avail(this);
  if ((int)len < iVar1) {
    memcpy(this->cur_,buf,len);
    this->cur_ = this->cur_ + len;
  }
  return;
}

Assistant:

void append(const char* buf, size_t len) {
    if (avail() > static_cast<int>(len)) {
      memcpy(cur_, buf, len);
      cur_ += len;
    }
  }